

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  Display *pDVar1;
  bool bVar2;
  X11_info *pXVar3;
  Display *dpy;
  CImgDisplay *this_local;
  
  bVar2 = is_empty(this);
  this_local = this;
  if ((!bVar2) && ((this->_is_closed & 1U) != 0)) {
    pXVar3 = cimg::X11_attr();
    pDVar1 = pXVar3->display;
    XLockDisplay(pDVar1);
    if ((this->_is_fullscreen & 1U) != 0) {
      _init_fullscreen(this);
    }
    _map_window(this);
    this->_is_closed = false;
    XUnlockDisplay(pDVar1);
    this_local = paint(this,true);
  }
  return this_local;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      _is_closed = false;
      XUnlockDisplay(dpy);
      return paint();
    }